

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  size_t sVar1;
  ImVector<char> *this;
  char *pcVar2;
  char *in_RSI;
  char *text_end;
  ImGuiContext *g;
  int new_size;
  ImVector<char> *in_stack_ffffffffffffffe0;
  
  ImVector<char>::clear(in_stack_ffffffffffffffe0);
  sVar1 = strlen(in_RSI);
  this = (ImVector<char> *)(in_RSI + sVar1);
  new_size = (int)((ulong)in_RSI >> 0x20);
  ImVector<char>::resize(this,new_size);
  pcVar2 = ImVector<char>::operator[](this,new_size);
  memcpy(pcVar2,in_RSI,(long)this - (long)in_RSI);
  pcVar2 = ImVector<char>::operator[](this,new_size);
  *pcVar2 = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.ClipboardHandlerData.clear();
    const char* text_end = text + strlen(text);
    g.ClipboardHandlerData.resize((int)(text_end - text) + 1);
    memcpy(&g.ClipboardHandlerData[0], text, (size_t)(text_end - text));
    g.ClipboardHandlerData[(int)(text_end - text)] = 0;
}